

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_test.cc
# Opt level: O2

void __thiscall
(anonymous_namespace)::BlendA64MaskTest8B_ExtremeValues_Test::~BlendA64MaskTest8B_ExtremeValues_Test
          (BlendA64MaskTest8B_ExtremeValues_Test *this)

{
  anon_unknown.dwarf_17b8f50::BlendA64MaskTest8B_ExtremeValues_Test::
  ~BlendA64MaskTest8B_ExtremeValues_Test((BlendA64MaskTest8B_ExtremeValues_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(BlendA64MaskTest8B, ExtremeValues) {
  for (int i = 0; i < kBufSize; ++i) {
    dst_ref_[i] = rng_(2) + 254;
    dst_tst_[i] = rng_(2) + 254;
    src0_[i] = rng_(2) + 254;
    src1_[i] = rng_(2) + 254;
  }

  for (int i = 0; i < kMaxMaskSize; ++i)
    mask_[i] = rng_(2) + AOM_BLEND_A64_MAX_ALPHA - 1;

  for (int bsize = 0; bsize < BLOCK_SIZES_ALL && !HasFatalFailure(); ++bsize)
    RunTest(bsize, 1);
}